

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int changeTempStorage(Parse *pParse,char *zStorageType)

{
  sqlite3 *psVar1;
  byte bVar2;
  uint uVar3;
  byte bVar4;
  byte *pbVar5;
  byte bVar6;
  byte *pbVar7;
  
  bVar2 = *zStorageType;
  bVar6 = bVar2 - 0x30;
  if (2 < bVar6) {
    bVar4 = bVar2;
    if (bVar2 == 0) {
      pbVar5 = (byte *)0x1ae655;
    }
    else {
      pbVar7 = (byte *)(zStorageType + 1);
      pbVar5 = (byte *)0x1ae655;
      do {
        if (""[bVar4] != ""[*pbVar5]) break;
        pbVar5 = pbVar5 + 1;
        bVar4 = *pbVar7;
        pbVar7 = pbVar7 + 1;
      } while (bVar4 != 0);
    }
    bVar6 = 1;
    if (""[bVar4] != ""[*pbVar5]) {
      if (bVar2 == 0) {
        pbVar5 = (byte *)0x1ae4ad;
      }
      else {
        pbVar7 = (byte *)(zStorageType + 1);
        pbVar5 = (byte *)0x1ae4ad;
        do {
          if (""[bVar2] != ""[*pbVar5]) break;
          pbVar5 = pbVar5 + 1;
          bVar2 = *pbVar7;
          pbVar7 = pbVar7 + 1;
        } while (bVar2 != 0);
      }
      bVar6 = (""[bVar2] == ""[*pbVar5]) * '\x02';
    }
  }
  psVar1 = pParse->db;
  bVar2 = psVar1->temp_store;
  uVar3 = (uint)bVar2;
  if ((bVar6 != bVar2) && (uVar3 = invalidateTempStorage(pParse), uVar3 == 0)) {
    psVar1->temp_store = bVar6;
  }
  return uVar3;
}

Assistant:

static int changeTempStorage(Parse *pParse, const char *zStorageType){
  int ts = getTempStore(zStorageType);
  sqlite3 *db = pParse->db;
  if( db->temp_store==ts ) return SQLITE_OK;
  if( invalidateTempStorage( pParse ) != SQLITE_OK ){
    return SQLITE_ERROR;
  }
  db->temp_store = (u8)ts;
  return SQLITE_OK;
}